

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

CWire * __thiscall CSegment::Pupate(CSegment *this)

{
  CPoint *pCVar1;
  CPoint *pCVar2;
  CWire *this_00;
  
  this_00 = CWire::New();
  if (this_00 == (CWire *)0x0) {
    __assert_fail("pWire",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                  ,0xfb,"CWire *CSegment::Pupate()");
  }
  pCVar1 = this->m_pPointE;
  pCVar2 = this->m_pPointS;
  if (pCVar2->m_cZ == pCVar1->m_cZ) {
    CWire::Initialize(this_00,(int)pCVar2->m_iX,(int)pCVar2->m_iY,(int)pCVar1->m_iX,
                      (int)pCVar1->m_iY,(int)pCVar2->m_cZ);
    return this_00;
  }
  __assert_fail("m_pPointS->Z()==m_pPointE->Z()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                ,0xfc,"CWire *CSegment::Pupate()");
}

Assistant:

CWire* CSegment::Pupate()
{
	CWire*	pWire	=	CWire::New();//new	CWire;

	assert(pWire);
	assert(m_pPointS->Z()==m_pPointE->Z());

	pWire->Initialize(m_pPointS->X(),m_pPointS->Y(),m_pPointE->X(),m_pPointE->Y(),m_pPointS->Z());

	// this will be deleted by CWire [6/30/2006 thyeros]
	return	pWire;
}